

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenStructConstructor
          (CppGenerator *this,StructDef *struct_def,GenArrayArgMode array_mode)

{
  FieldDef *pFVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  reference ppFVar5;
  Value *type_00;
  ulong uVar6;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *this_00;
  bool local_56b;
  byte local_569;
  allocator<char> local_559;
  string local_558;
  string local_538;
  function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
  local_518;
  undefined1 local_4f8 [8];
  string padding;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  string local_418;
  undefined1 local_3f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg_name_1;
  undefined1 local_3b8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  undefined1 local_370 [8];
  string get_array;
  string face_type;
  undefined1 local_328 [7];
  bool is_enum;
  Type *local_308;
  Type *element_type;
  Type *type_1;
  FieldDef **field_1;
  const_iterator __end3;
  const_iterator __begin3;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range3;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  allocator<char> local_259;
  string local_258;
  allocator<char> local_231;
  string local_230;
  function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
  local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  undefined1 local_170 [8];
  string scalar_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_e0;
  undefined1 local_c0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg_name;
  bool is_array;
  Type *type;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_80;
  const_iterator it;
  const_iterator cStack_70;
  bool init_arrays;
  const_iterator first;
  undefined1 local_60 [4];
  int padding_id;
  string init_list;
  string arg_list;
  GenArrayArgMode array_mode_local;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  std::__cxx11::string::string((string *)(init_list.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_60);
  first._M_current._4_4_ = 0;
  cStack_70 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                        (&(struct_def->fields).vec);
  it._M_current._7_1_ = array_mode != kArrayArgModeNone;
  local_80._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar2 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar2) break;
    ppFVar5 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_80);
    pFVar1 = *ppFVar5;
    type_00 = &pFVar1->value;
    arg_name.field_2._M_local_buf[0xf] = IsArray(&type_00->type);
    Name_abi_cxx11_(&local_e0,this,pFVar1);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,"_"
                   ,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    if (((arg_name.field_2._M_local_buf[0xf] & 1U) == 0) || ((it._M_current._7_1_ & 1) != 0)) {
      bVar2 = __gnu_cxx::operator!=(&local_80,&stack0xffffffffffffff90);
      if ((bVar2) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
        std::__cxx11::string::operator+=((string *)(init_list.field_2._M_local_buf + 8),", ");
      }
      if ((arg_name.field_2._M_local_buf[0xf] & 1U) == 0) {
        GenTypeGet_abi_cxx11_(&local_110,this,&type_00->type," ","const "," &",true);
      }
      else {
        GenTypeSpan_abi_cxx11_
                  (&local_110,this,&type_00->type,true,(ulong)(pFVar1->value).type.fixed_length);
      }
      std::__cxx11::string::operator+=
                ((string *)(init_list.field_2._M_local_buf + 8),(string *)&local_110);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::operator+=
                ((string *)(init_list.field_2._M_local_buf + 8),(string *)local_c0);
    }
    local_569 = 0;
    if ((arg_name.field_2._M_local_buf[0xf] & 1U) != 0) {
      local_569 = it._M_current._7_1_;
    }
    if ((local_569 & 1) == 0) {
      bVar2 = __gnu_cxx::operator!=(&local_80,&stack0xffffffffffffff90);
      if ((bVar2) && (uVar6 = std::__cxx11::string::empty(), (uVar6 & 1) == 0)) {
        std::__cxx11::string::operator+=((string *)local_60,",\n        ");
      }
      Name_abi_cxx11_((string *)((long)&scalar_type.field_2 + 8),this,pFVar1);
      std::operator+(&local_130,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&scalar_type.field_2 + 8),"_");
      std::__cxx11::string::operator+=((string *)local_60,(string *)&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)(scalar_type.field_2._M_local_buf + 8));
      bVar2 = IsScalar((type_00->type).base_type);
      if (bVar2) {
        GenUnderlyingCast((string *)local_170,this,pFVar1,false,(string *)local_c0);
        std::operator+(&local_1b0,"(::flatbuffers::EndianScalar(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_170);
        std::operator+(&local_190,&local_1b0,"))");
        std::__cxx11::string::operator+=((string *)local_60,(string *)&local_190);
        std::__cxx11::string::~string((string *)&local_190);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)local_170);
      }
      else {
        if (((arg_name.field_2._M_local_buf[0xf] & 1U) == 0) ||
           (local_56b = true, (it._M_current._7_1_ & 1) != 0)) {
          local_56b = IsStruct(&type_00->type);
        }
        if (local_56b == false) {
          __assert_fail("(is_array && !init_arrays) || IsStruct(type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                        ,0xf18,
                        "void flatbuffers::cpp::CppGenerator::GenStructConstructor(const StructDef &, GenArrayArgMode)"
                       );
        }
        if ((arg_name.field_2._M_local_buf[0xf] & 1U) == 0) {
          std::operator+(&local_1f0,"(",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c0);
          std::operator+(&local_1d0,&local_1f0,")");
          std::__cxx11::string::operator+=((string *)local_60,(string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::~string((string *)&local_1f0);
        }
        else {
          std::__cxx11::string::operator+=((string *)local_60,"()");
        }
      }
    }
    if (pFVar1->padding != 0) {
      std::function<void(int,std::__cxx11::string*,int*)>::
      function<void(&)(int,std::__cxx11::string*,int*),void>
                ((function<void(int,std::__cxx11::string*,int*)> *)&local_210,PaddingInitializer);
      GenPadding(pFVar1,(string *)local_60,(int *)((long)&first._M_current + 4),&local_210);
      std::
      function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
      ::~function(&local_210);
    }
    std::__cxx11::string::~string((string *)local_c0);
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_80);
  }
  uVar6 = std::__cxx11::string::empty();
  if ((uVar6 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"ARG_LIST",&local_231);
    CodeWriter::SetValue(&this->code_,&local_230,(string *)((long)&init_list.field_2 + 8));
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"INIT_LIST",&local_259);
    CodeWriter::SetValue(&this->code_,&local_258,(string *)local_60);
    std::__cxx11::string::~string((string *)&local_258);
    std::allocator<char>::~allocator(&local_259);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_280,"  {{STRUCT_NAME}}({{ARG_LIST}})",&local_281);
      CodeWriter::operator+=(&this->code_,&local_280);
      std::__cxx11::string::~string((string *)&local_280);
      std::allocator<char>::~allocator(&local_281);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2a8,"      : {{INIT_LIST}} {",&local_2a9);
      CodeWriter::operator+=(&this->code_,&local_2a8);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::allocator<char>::~allocator(&local_2a9);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d0,"  {{STRUCT_NAME}}({{ARG_LIST}}) {",
                 (allocator<char> *)((long)&__range3 + 7));
      CodeWriter::operator+=(&this->code_,&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range3 + 7));
    }
    first._M_current._4_4_ = 0;
    this_00 = &(struct_def->fields).vec;
    __end3 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                       (this_00);
    field_1 = (FieldDef **)
              std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                        (this_00);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                       *)&field_1), bVar2) {
      type_1 = (Type *)__gnu_cxx::
                       __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                       ::operator*(&__end3);
      element_type = &((*(FieldDef **)type_1)->value).type;
      bVar2 = IsArray(element_type);
      if ((bVar2) && ((it._M_current._7_1_ & 1) != 0)) {
        Type::VectorType((Type *)local_328,element_type);
        local_308 = (Type *)local_328;
        bVar2 = IsEnum(local_308);
        bVar3 = IsScalar(local_308->base_type);
        if (bVar3) {
LAB_001f71bd:
          bVar3 = true;
        }
        else {
          bVar4 = IsStruct(local_308);
          bVar3 = false;
          if (bVar4) goto LAB_001f71bd;
        }
        if (!bVar3) {
          __assert_fail("(IsScalar(element_type.base_type) || IsStruct(element_type)) && \"invalid declaration\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                        ,0xf34,
                        "void flatbuffers::cpp::CppGenerator::GenStructConstructor(const StructDef &, GenArrayArgMode)"
                       );
        }
        GenTypeGet_abi_cxx11_
                  ((string *)((long)&get_array.field_2 + 8),this,element_type," ","","",bVar2);
        field_name.field_2._M_local_buf[0xf] = '\0';
        field_name.field_2._M_local_buf[0xd] = '\0';
        if (bVar2) {
          std::operator+(&local_390,"CastToArrayOfEnum<",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&get_array.field_2 + 8));
          field_name.field_2._M_local_buf[0xf] = '\x01';
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_370,&local_390,">");
        }
        else {
          std::allocator<char>::allocator();
          field_name.field_2._M_local_buf[0xd] = '\x01';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_370,"CastToArray",
                     (allocator<char> *)(field_name.field_2._M_local_buf + 0xe));
        }
        if ((field_name.field_2._M_local_buf[0xd] & 1U) != 0) {
          std::allocator<char>::~allocator
                    ((allocator<char> *)(field_name.field_2._M_local_buf + 0xe));
        }
        if ((field_name.field_2._M_local_buf[0xf] & 1U) != 0) {
          std::__cxx11::string::~string((string *)&local_390);
        }
        Name_abi_cxx11_((string *)((long)&arg_name_1.field_2 + 8),this,*(FieldDef **)type_1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&arg_name_1.field_2 + 8),"_");
        std::__cxx11::string::~string((string *)(arg_name_1.field_2._M_local_buf + 8));
        Name_abi_cxx11_(&local_418,this,*(FieldDef **)type_1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3f8,"_",&local_418);
        std::__cxx11::string::~string((string *)&local_418);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&padding.field_2 + 8),"    ::flatbuffers::",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_370);
        std::operator+(&local_4b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&padding.field_2 + 8),"(");
        std::operator+(&local_498,&local_4b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3b8);
        std::operator+(&local_478,&local_498,").CopyFromSpan(");
        std::operator+(&local_458,&local_478,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3f8);
        std::operator+(&local_438,&local_458,");");
        CodeWriter::operator+=(&this->code_,&local_438);
        std::__cxx11::string::~string((string *)&local_438);
        std::__cxx11::string::~string((string *)&local_458);
        std::__cxx11::string::~string((string *)&local_478);
        std::__cxx11::string::~string((string *)&local_498);
        std::__cxx11::string::~string((string *)&local_4b8);
        std::__cxx11::string::~string((string *)(padding.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_3f8);
        std::__cxx11::string::~string((string *)local_3b8);
        std::__cxx11::string::~string((string *)local_370);
        std::__cxx11::string::~string((string *)(get_array.field_2._M_local_buf + 8));
      }
      if (*(long *)(*(long *)type_1 + 0x128) != 0) {
        std::__cxx11::string::string((string *)local_4f8);
        pFVar1 = *(FieldDef **)type_1;
        std::function<void(int,std::__cxx11::string*,int*)>::
        function<void(&)(int,std::__cxx11::string*,int*),void>
                  ((function<void(int,std::__cxx11::string*,int*)> *)&local_518,PaddingNoop);
        GenPadding(pFVar1,(string *)local_4f8,(int *)((long)&first._M_current + 4),&local_518);
        std::
        function<void_(int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_int_*)>
        ::~function(&local_518);
        std::__cxx11::string::string((string *)&local_538,(string *)local_4f8);
        CodeWriter::operator+=(&this->code_,&local_538);
        std::__cxx11::string::~string((string *)&local_538);
        std::__cxx11::string::~string((string *)local_4f8);
      }
      __gnu_cxx::
      __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
      ::operator++(&__end3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_558,"  }",&local_559);
    CodeWriter::operator+=(&this->code_,&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    std::allocator<char>::~allocator(&local_559);
  }
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(init_list.field_2._M_local_buf + 8));
  return;
}

Assistant:

void GenStructConstructor(const StructDef &struct_def,
                            GenArrayArgMode array_mode) {
    std::string arg_list;
    std::string init_list;
    int padding_id = 0;
    auto first = struct_def.fields.vec.begin();
    // skip arrays if generate ctor without array assignment
    const auto init_arrays = (array_mode != kArrayArgModeNone);
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      const auto &type = field.value.type;
      const auto is_array = IsArray(type);
      const auto arg_name = "_" + Name(field);
      if (!is_array || init_arrays) {
        if (it != first && !arg_list.empty()) { arg_list += ", "; }
        arg_list += !is_array ? GenTypeGet(type, " ", "const ", " &", true)
                              : GenTypeSpan(type, true, type.fixed_length);
        arg_list += arg_name;
      }
      // skip an array with initialization from span
      if (false == (is_array && init_arrays)) {
        if (it != first && !init_list.empty()) { init_list += ",\n        "; }
        init_list += Name(field) + "_";
        if (IsScalar(type.base_type)) {
          auto scalar_type = GenUnderlyingCast(field, false, arg_name);
          init_list += "(::flatbuffers::EndianScalar(" + scalar_type + "))";
        } else {
          FLATBUFFERS_ASSERT((is_array && !init_arrays) || IsStruct(type));
          if (!is_array)
            init_list += "(" + arg_name + ")";
          else
            init_list += "()";
        }
      }
      if (field.padding)
        GenPadding(field, &init_list, &padding_id, PaddingInitializer);
    }

    if (!arg_list.empty()) {
      code_.SetValue("ARG_LIST", arg_list);
      code_.SetValue("INIT_LIST", init_list);
      if (!init_list.empty()) {
        code_ += "  {{STRUCT_NAME}}({{ARG_LIST}})";
        code_ += "      : {{INIT_LIST}} {";
      } else {
        code_ += "  {{STRUCT_NAME}}({{ARG_LIST}}) {";
      }
      padding_id = 0;
      for (const auto &field : struct_def.fields.vec) {
        const auto &type = field->value.type;
        if (IsArray(type) && init_arrays) {
          const auto &element_type = type.VectorType();
          const auto is_enum = IsEnum(element_type);
          FLATBUFFERS_ASSERT(
              (IsScalar(element_type.base_type) || IsStruct(element_type)) &&
              "invalid declaration");
          const auto face_type = GenTypeGet(type, " ", "", "", is_enum);
          std::string get_array =
              is_enum ? "CastToArrayOfEnum<" + face_type + ">" : "CastToArray";
          const auto field_name = Name(*field) + "_";
          const auto arg_name = "_" + Name(*field);
          code_ += "    ::flatbuffers::" + get_array + "(" + field_name +
                   ").CopyFromSpan(" + arg_name + ");";
        }
        if (field->padding) {
          std::string padding;
          GenPadding(*field, &padding, &padding_id, PaddingNoop);
          code_ += padding;
        }
      }
      code_ += "  }";
    }
  }